

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_char,float>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          float *out_value)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  pointer puVar4;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  
  uVar9 = *(uint *)&this->num_components_;
  bVar7 = out_num_components;
  if ((byte)uVar9 < out_num_components) {
    bVar7 = (byte)uVar9;
  }
  if (bVar7 != 0) {
    lVar3 = this->byte_stride_;
    puVar4 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = this->byte_offset_;
    pbVar6 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar2 = this->normalized_;
    uVar8 = 0;
    do {
      pbVar1 = puVar4 + uVar8 + lVar5 + (ulong)att_id.value_ * lVar3;
      if (pbVar6 <= pbVar1) {
        return false;
      }
      fVar11 = (float)*pbVar1;
      fVar10 = fVar11 / 255.0;
      if ((bVar2 & 1U) == 0) {
        fVar10 = fVar11;
      }
      out_value[uVar8] = fVar10;
      uVar8 = uVar8 + 1;
      uVar9 = *(uint *)&this->num_components_;
      bVar7 = (byte)uVar9;
      if (out_num_components <= (byte)uVar9) {
        bVar7 = out_num_components;
      }
    } while (uVar8 < bVar7);
  }
  if ((byte)uVar9 < out_num_components) {
    memset(out_value + (uVar9 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar9 & 0xff)) * 4 + 4)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }